

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walBusyLock(Wal *pWal,_func_int_void_ptr *xBusy,void *pBusyArg,int lockIdx,int n)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  Wal *in_RDX;
  code *in_RSI;
  int in_R8D;
  bool bVar3;
  int rc;
  
  do {
    iVar1 = walLockExclusive(in_RDX,in_ECX,in_R8D);
    bVar3 = false;
    if ((in_RSI != (code *)0x0) && (bVar3 = false, iVar1 == 5)) {
      iVar2 = (*in_RSI)(in_RDX);
      bVar3 = iVar2 != 0;
    }
  } while (bVar3);
  return iVar1;
}

Assistant:

static int walBusyLock(
  Wal *pWal,                      /* WAL connection */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int lockIdx,                    /* Offset of first byte to lock */
  int n                           /* Number of bytes to lock */
){
  int rc;
  do {
    rc = walLockExclusive(pWal, lockIdx, n);
  }while( xBusy && rc==SQLITE_BUSY && xBusy(pBusyArg) );
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ){
    walDisableBlocking(pWal);
    rc = SQLITE_BUSY;
  }
#endif
  return rc;
}